

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

int get_tx_type_cost(MACROBLOCK *x,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,TX_TYPE tx_type,
                    int reduced_tx_set_used)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  byte in_CL;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  PREDICTION_MODE intra_dir;
  int ext_tx_set;
  int is_inter;
  MB_MODE_INFO *mbmi;
  TX_SIZE square_tx_size;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  TX_SIZE tx_size_00;
  
  if (0 < in_EDX) {
    return 0;
  }
  bVar1 = ""[in_CL];
  lVar3 = **(long **)(in_RSI + 0x1eb8);
  iVar4 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffffc4 >> 0x18);
  iVar5 = get_ext_tx_types(tx_size_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if ((1 < iVar5) &&
     (*(int *)(in_RSI + 0x29c4 +
              (ulong)((byte)*(undefined2 *)(**(long **)(in_RSI + 0x1eb8) + 0xa7) & 7) * 4) == 0)) {
    iVar5 = get_ext_tx_set(tx_size_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar4 == 0) {
      if (0 < iVar5) {
        if (*(char *)(lVar3 + 0x5b) == '\0') {
          bVar2 = *(byte *)(lVar3 + 2);
        }
        else {
          bVar2 = ""[*(byte *)(lVar3 + 0x5a)];
        }
        return *(int *)(in_RDI + 0x9230 + (long)iVar5 * 0xd00 + (ulong)bVar1 * 0x340 +
                        (ulong)bVar2 * 0x40 + (ulong)in_R8B * 4);
      }
    }
    else if (0 < iVar5) {
      return *(int *)(in_RDI + 0x8e30 + (long)iVar5 * 0x100 + (ulong)bVar1 * 0x40 +
                     (ulong)in_R8B * 4);
    }
  }
  return 0;
}

Assistant:

static int get_tx_type_cost(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            int plane, TX_SIZE tx_size, TX_TYPE tx_type,
                            int reduced_tx_set_used) {
  if (plane > 0) return 0;

  const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, reduced_tx_set_used) > 1 &&
      !xd->lossless[xd->mi[0]->segment_id]) {
    const int ext_tx_set =
        get_ext_tx_set(tx_size, is_inter, reduced_tx_set_used);
    if (is_inter) {
      if (ext_tx_set > 0)
        return x->mode_costs
            .inter_tx_type_costs[ext_tx_set][square_tx_size][tx_type];
    } else {
      if (ext_tx_set > 0) {
        PREDICTION_MODE intra_dir;
        if (mbmi->filter_intra_mode_info.use_filter_intra)
          intra_dir = fimode_to_intradir[mbmi->filter_intra_mode_info
                                             .filter_intra_mode];
        else
          intra_dir = mbmi->mode;
        return x->mode_costs.intra_tx_type_costs[ext_tx_set][square_tx_size]
                                                [intra_dir][tx_type];
      }
    }
  }
  return 0;
}